

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::stackUnder(QWidget *this,QWidget *w)

{
  long lVar1;
  long *plVar2;
  QWidgetPrivate *this_00;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long unaff_R12;
  int iVar8;
  long unaff_R13;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((w == (QWidget *)0x0) ||
      (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) || (w == this)) goto LAB_0030fa7c;
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  lVar3 = *(long *)&this_00->field_0x10;
  if (lVar3 != *(long *)(*(long *)&w->field_0x8 + 0x10)) goto LAB_0030fa7c;
  if (lVar3 != 0) {
    lVar4 = *(long *)(lVar3 + 8);
    lVar5 = *(long *)(lVar4 + 0x28);
    if (lVar5 == 0) {
LAB_0030f9a4:
      iVar7 = -1;
    }
    else {
      lVar6 = -8;
      do {
        iVar7 = (int)unaff_R12;
        lVar1 = lVar5 * -8 + lVar6;
        if (lVar1 == -8) goto LAB_0030f99e;
        unaff_R12 = lVar6 + 8;
        plVar2 = (long *)(*(long *)(lVar4 + 0x20) + 8 + lVar6);
        lVar6 = unaff_R12;
      } while ((QWidget *)*plVar2 != this);
      iVar7 = (int)(unaff_R12 >> 3);
LAB_0030f99e:
      if (lVar1 == -8) goto LAB_0030f9a4;
    }
    if (lVar5 == 0) {
LAB_0030f9e4:
      iVar8 = -1;
    }
    else {
      lVar6 = -8;
      do {
        iVar8 = (int)unaff_R13;
        lVar1 = lVar5 * -8 + lVar6;
        if (lVar1 == -8) goto LAB_0030f9de;
        unaff_R13 = lVar6 + 8;
        plVar2 = (long *)(*(long *)(lVar4 + 0x20) + 8 + lVar6);
        lVar6 = unaff_R13;
      } while ((QWidget *)*plVar2 != w);
      iVar8 = (int)(unaff_R13 >> 3);
LAB_0030f9de:
      if (lVar1 == -8) goto LAB_0030f9e4;
    }
    iVar8 = iVar8 - (uint)(iVar7 < iVar8);
    if (iVar8 != iVar7) {
      w = (QWidget *)(long)iVar7;
      QList<QObject_*>::move((QList<QObject_*> *)(lVar4 + 0x18),(qsizetype)w,(long)iVar8);
    }
    if (((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) == 0) &&
       ((*(byte *)(*(long *)(lVar3 + 8) + 0x243) & 0x10) != 0)) {
      w = (QWidget *)0x0;
      create(this,0,false,false);
    }
    else if (iVar8 == iVar7) goto LAB_0030fa7c;
  }
  if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0) {
    QWidgetPrivate::stackUnder_sys(this_00,w);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,ZOrderChange);
  QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
  QEvent::~QEvent((QEvent *)&local_48);
LAB_0030fa7c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::stackUnder(QWidget* w)
{
    Q_D(QWidget);
    QWidget *p = parentWidget();
    if (!w || isWindow() || p != w->parentWidget() || this == w)
        return;
    if (p) {
        int from = p->d_func()->children.indexOf(this);
        int to = p->d_func()->children.indexOf(w);
        Q_ASSERT(from >= 0);
        Q_ASSERT(to >= 0);
        if (from < to)
            --to;
        // Do nothing if the widget is already in correct stacking order _and_ created.
        if (from != to)
            p->d_func()->children.move(from, to);
        if (!testAttribute(Qt::WA_WState_Created) && p->testAttribute(Qt::WA_WState_Created))
            create();
        else if (from == to)
            return;
    }
    if (testAttribute(Qt::WA_WState_Created))
        d->stackUnder_sys(w);

    QEvent e(QEvent::ZOrderChange);
    QCoreApplication::sendEvent(this, &e);
}